

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O0

double __thiscall Solution::total_weight(Solution *this)

{
  bool bVar1;
  reference ppVVar2;
  double dVar3;
  Vehicle *vehicle;
  iterator __end1;
  iterator __begin1;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> *__range1;
  double ret;
  Solution *this_local;
  
  __range1 = (list<Vehicle_*,_std::allocator<Vehicle_*>_> *)0x0;
  __end1 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&this->vehicles);
  vehicle = (Vehicle *)
            std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::end(&this->vehicles);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&vehicle);
    if (!bVar1) break;
    ppVVar2 = std::_List_iterator<Vehicle_*>::operator*(&__end1);
    dVar3 = Vehicle::get_weight(*ppVVar2);
    __range1 = (list<Vehicle_*,_std::allocator<Vehicle_*>_> *)(dVar3 + (double)__range1);
    std::_List_iterator<Vehicle_*>::operator++(&__end1);
  }
  this->weight = (double)__range1;
  return (double)__range1;
}

Assistant:

double Solution::total_weight() {
    double ret = 0;
    for (auto vehicle: vehicles) {
        ret += vehicle->get_weight();
    }
    weight = ret;
    return ret;
}